

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  bool bVar1;
  int iVar2;
  InstOp IVar3;
  int iVar4;
  int iVar5;
  EmptyOp EVar6;
  ostream *poVar7;
  ostream *this_00;
  LogMessage local_1b8;
  Inst *local_38;
  Inst *ip;
  int *piStack_28;
  int nstk;
  int *stk;
  uint32_t flag_local;
  int id_local;
  Workq *q_local;
  DFA *this_local;
  
  stk._0_4_ = flag;
  stk._4_4_ = id;
  _flag_local = q;
  q_local = (Workq *)this;
  piStack_28 = PODArray<int>::data(&this->stack_);
  ip._4_4_ = 1;
  *piStack_28 = stk._4_4_;
LAB_0034e5e0:
  do {
    iVar4 = ip._4_4_;
    if (ip._4_4_ < 1) {
      return;
    }
    iVar2 = PODArray<int>::size(&this->stack_);
    if (iVar2 < iVar4) {
      __assert_fail("(nstk) <= (stack_.size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/dfa.cc"
                    ,0x340,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
    }
    ip._4_4_ = ip._4_4_ + -1;
    stk._4_4_ = piStack_28[ip._4_4_];
    while (stk._4_4_ != -1) {
      if ((stk._4_4_ == 0) ||
         (bVar1 = SparseSetT<void>::contains(&_flag_local->super_SparseSet,stk._4_4_), bVar1))
      goto LAB_0034e5e0;
      Workq::insert_new(_flag_local,stk._4_4_);
      local_38 = Prog::inst(this->prog_,stk._4_4_);
      IVar3 = Prog::Inst::opcode(local_38);
      switch(IVar3) {
      case kInstAltMatch:
        iVar4 = Prog::Inst::last(local_38);
        if (iVar4 != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/dfa.cc"
                        ,0x373,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
        }
        stk._4_4_ = stk._4_4_ + 1;
        break;
      case kInstByteRange:
      case kInstMatch:
        iVar4 = Prog::Inst::last(local_38);
        if (iVar4 != 0) goto LAB_0034e5e0;
        stk._4_4_ = stk._4_4_ + 1;
        break;
      case kInstCapture:
      case kInstNop:
        iVar4 = Prog::Inst::last(local_38);
        if (iVar4 == 0) {
          piStack_28[ip._4_4_] = stk._4_4_ + 1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        IVar3 = Prog::Inst::opcode(local_38);
        if ((((IVar3 == kInstNop) &&
             (iVar2 = Workq::maxmark(_flag_local), iVar4 = stk._4_4_, 0 < iVar2)) &&
            (iVar5 = Prog::start_unanchored(this->prog_), iVar2 = stk._4_4_, iVar4 == iVar5)) &&
           (iVar4 = Prog::start(this->prog_), iVar2 != iVar4)) {
          piStack_28[ip._4_4_] = -1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        stk._4_4_ = Prog::Inst::out(local_38);
        break;
      case kInstEmptyWidth:
        iVar4 = Prog::Inst::last(local_38);
        if (iVar4 == 0) {
          piStack_28[ip._4_4_] = stk._4_4_ + 1;
          ip._4_4_ = ip._4_4_ + 1;
        }
        EVar6 = Prog::Inst::empty(local_38);
        if ((EVar6 & ((EmptyOp)stk ^ 0xffffffff)) != 0) goto LAB_0034e5e0;
        stk._4_4_ = Prog::Inst::out(local_38);
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/dfa.cc"
                   ,0x359);
        poVar7 = LogMessage::stream(&local_1b8);
        this_00 = std::operator<<((ostream *)poVar7,"unhandled opcode: ");
        IVar3 = Prog::Inst::opcode(local_38);
        std::ostream::operator<<(this_00,IVar3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
      }
    }
    Workq::mark(_flag_local);
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}